

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowGroup::GetCommittedSelVector
          (RowGroup *this,transaction_t start_time,transaction_t transaction_id,idx_t vector_idx,
          SelectionVector *sel_vector,idx_t max_count)

{
  RowVersionManager *this_00;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_30;
  
  local_30 = GetVersionInfo(this);
  if (local_30.ptr != (RowVersionManager *)0x0) {
    this_00 = optional_ptr<duckdb::RowVersionManager,_true>::operator->(&local_30);
    max_count = RowVersionManager::GetCommittedSelVector
                          (this_00,start_time,transaction_id,vector_idx,sel_vector,max_count);
  }
  return max_count;
}

Assistant:

idx_t RowGroup::GetCommittedSelVector(transaction_t start_time, transaction_t transaction_id, idx_t vector_idx,
                                      SelectionVector &sel_vector, idx_t max_count) {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return max_count;
	}
	return vinfo->GetCommittedSelVector(start_time, transaction_id, vector_idx, sel_vector, max_count);
}